

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::Array<unsigned_char>_> * __thiscall
kj::ArrayBuilder<kj::Array<unsigned_char>_>::operator=
          (ArrayBuilder<kj::Array<unsigned_char>_> *this,
          ArrayBuilder<kj::Array<unsigned_char>_> *other)

{
  Array<unsigned_char> *pAVar1;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar2;
  Array<unsigned_char> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Array<unsigned_char> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Array<unsigned_char> *)0x0;
    this->pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
    this->endPtr = (Array<unsigned_char> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Array<unsigned_char>_>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Array<unsigned_char> *)0x0;
  other->pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  other->endPtr = (Array<unsigned_char> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }